

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask16_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x10 | *out;
  puVar1 = out + 1;
  *puVar1 = in[2];
  *puVar1 = in[3] << 0x10 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[4];
  *puVar1 = in[5] << 0x10 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[6];
  *puVar1 = in[7] << 0x10 | *puVar1;
  return out + 4;
}

Assistant:

uint32_t *__fastpackwithoutmask16_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;

  return out;
}